

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::PartialResponseService::request
          (PartialResponseService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  _func_int *p_Var1;
  SourceLocation location;
  HttpService HVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  SimpleTransformPromiseNode<kj::Array<unsigned_char>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4460:15)>
  *location_00;
  AsyncInputStream local_70;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  anon_class_16_2_1e9c3a7c_for_func local_58;
  HttpService local_48;
  undefined *local_40;
  undefined *puStack_38;
  undefined8 local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  AsyncInputStream::readAllBytes(&local_70,(uint64_t)response);
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::Array<unsigned_char>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:4460:15)>
       ::anon_class_16_2_1e9c3a7c_for_func::operator();
  p_Var1 = local_70._vptr_AsyncInputStream[1];
  local_58.this = (PartialResponseService *)CONCAT44(in_register_00000034,method);
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_70._vptr_AsyncInputStream - (long)p_Var1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<kj::Array<unsigned_char>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4460:15)>
                   *)((long)pvVar3 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Array<unsigned_char>,kj::(anonymous_namespace)::PartialResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda(kj::Array<unsigned_char>&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PartialResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda(kj::Array<unsigned_char>&&)_1_,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70,&local_58,
               &continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    local_70._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    location_00 = (SimpleTransformPromiseNode<kj::Array<unsigned_char>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:4460:15)>
                   *)(local_70._vptr_AsyncInputStream + -6);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Array<unsigned_char>,kj::(anonymous_namespace)::PartialResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda(kj::Array<unsigned_char>&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PartialResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda(kj::Array<unsigned_char>&&)_1_,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70,&local_58,
               &continuationTracePtr);
    local_70._vptr_AsyncInputStream[-5] = p_Var1;
  }
  local_40 = &DAT_003d3151;
  puStack_38 = &DAT_003d31b0;
  local_30 = 0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<void>((OwnPromiseNode *)&local_48,(Promise<void> *)&intermediate,location);
  HVar2._vptr_HttpService = local_48._vptr_HttpService;
  local_48._vptr_HttpService = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
  (this->super_HttpService)._vptr_HttpService = HVar2._vptr_HttpService;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      auto body = response.send(200, "OK", headers, 32);
      auto promise = body->write("foo"_kjb);
      return promise.attach(kj::mv(body)).then([]() -> kj::Promise<void> {
        return KJ_EXCEPTION(FAILED, "failed");
      });
    });
  }